

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsLink.cpp
# Opt level: O0

bool Js::ASMLink::CheckMathLibraryMethod
               (ScriptContext *scriptContext,Var asmMathObject,
               AsmJSMathBuiltinFunction mathLibMethod)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  AsmJSMathBuiltinFunction mathLibMethod_local;
  Var asmMathObject_local;
  ScriptContext *scriptContext_local;
  
  switch(mathLibMethod) {
  case AsmJSMathBuiltin_sin:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x2f,(FunctionInfo *)Math::EntryInfo::Sin);
    break;
  case AsmJSMathBuiltin_cos:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x24,(FunctionInfo *)Math::EntryInfo::Cos);
    break;
  case AsmJSMathBuiltin_tan:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x31,(FunctionInfo *)Math::EntryInfo::Tan);
    break;
  case AsmJSMathBuiltin_asin:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x20,(FunctionInfo *)Math::EntryInfo::Asin);
    break;
  case AsmJSMathBuiltin_acos:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x1e,(FunctionInfo *)Math::EntryInfo::Acos);
    break;
  case AsmJSMathBuiltin_atan:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x21,(FunctionInfo *)Math::EntryInfo::Atan);
    break;
  case AsmJSMathBuiltin_ceil:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x23,(FunctionInfo *)Math::EntryInfo::Ceil);
    break;
  case AsmJSMathBuiltin_floor:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x26,(FunctionInfo *)Math::EntryInfo::Floor);
    break;
  case AsmJSMathBuiltin_exp:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x25,(FunctionInfo *)Math::EntryInfo::Exp);
    break;
  case AsmJSMathBuiltin_log:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x27,(FunctionInfo *)Math::EntryInfo::Log);
    break;
  case AsmJSMathBuiltin_pow:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x2c,(FunctionInfo *)Math::EntryInfo::Pow);
    break;
  case AsmJSMathBuiltin_sqrt:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x30,(FunctionInfo *)Math::EntryInfo::Sqrt);
    break;
  case AsmJSMathBuiltin_abs:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x1d,(FunctionInfo *)Math::EntryInfo::Abs);
    break;
  case AsmJSMathBuiltin_atan2:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x22,(FunctionInfo *)Math::EntryInfo::Atan2);
    break;
  case AsmJSMathBuiltin_imul:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x40,(FunctionInfo *)Math::EntryInfo::Imul);
    break;
  case AsmJSMathBuiltin_fround:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x42,(FunctionInfo *)Math::EntryInfo::Fround);
    break;
  case AsmJSMathBuiltin_min:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x2a,(FunctionInfo *)Math::EntryInfo::Min);
    break;
  case AsmJSMathBuiltin_max:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0xfe,(FunctionInfo *)Math::EntryInfo::Max);
    break;
  case AsmJSMathBuiltin_clz32:
    scriptContext_local._7_1_ =
         CheckIsBuiltinFunction
                   (scriptContext,asmMathObject,0x41,(FunctionInfo *)Math::EntryInfo::Clz32);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsLink.cpp"
                                ,0xa3,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    scriptContext_local._7_1_ = false;
    break;
  case AsmJSMathBuiltin_e:
    scriptContext_local._7_1_ =
         CheckIsBuiltinValue(scriptContext,asmMathObject,0x75,2.718281828459045);
    break;
  case AsmJSMathBuiltin_ln10:
    scriptContext_local._7_1_ =
         CheckIsBuiltinValue(scriptContext,asmMathObject,0xd3,2.302585092994046);
    break;
  case AsmJSMathBuiltin_ln2:
    scriptContext_local._7_1_ =
         CheckIsBuiltinValue(scriptContext,asmMathObject,0xd4,0.6931471805599453);
    break;
  case AsmJSMathBuiltin_log2e:
    scriptContext_local._7_1_ =
         CheckIsBuiltinValue(scriptContext,asmMathObject,0x29,1.4426950408889634);
    break;
  case AsmJSMathBuiltin_log10e:
    scriptContext_local._7_1_ =
         CheckIsBuiltinValue(scriptContext,asmMathObject,0x28,0.4342944819032518);
    break;
  case AsmJSMathBuiltin_pi:
    scriptContext_local._7_1_ =
         CheckIsBuiltinValue(scriptContext,asmMathObject,0x2b,3.141592653589793);
    break;
  case AsmJSMathBuiltin_sqrt1_2:
    scriptContext_local._7_1_ =
         CheckIsBuiltinValue(scriptContext,asmMathObject,0x157,0.7071067811865476);
    break;
  case AsmJSMathBuiltin_sqrt2:
    scriptContext_local._7_1_ =
         CheckIsBuiltinValue(scriptContext,asmMathObject,0x158,1.4142135623730951);
  }
  return scriptContext_local._7_1_;
}

Assistant:

bool ASMLink::CheckMathLibraryMethod(ScriptContext* scriptContext, const Var asmMathObject, const AsmJSMathBuiltinFunction mathLibMethod)
    {
        switch (mathLibMethod)
        {
#define ASMJS_MATH_FUNC_NAMES(name, propertyName, funcInfo) case AsmJSMathBuiltinFunction::AsmJSMathBuiltin_##name: \
            return CheckIsBuiltinFunction(scriptContext, asmMathObject, PropertyIds::##propertyName, funcInfo);
#include "AsmJsBuiltInNames.h"
#define ASMJS_MATH_DOUBLE_CONST_NAMES(name, propertyName, value) case AsmJSMathBuiltinFunction::AsmJSMathBuiltin_##name: \
            return CheckIsBuiltinValue(scriptContext, asmMathObject, PropertyIds::##propertyName, value);
#include "AsmJsBuiltInNames.h"
        default:
            Assume(UNREACHED);
        }
        return false;
    }